

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setStepSizeBounds
          (MultipleShootingTranscription *this,double minStepSize,double maxStepsize)

{
  char *pcVar1;
  
  if (minStepSize <= 0.0) {
    pcVar1 = "The minimum step size is expected to be positive.";
  }
  else {
    if (minStepSize + minStepSize < maxStepsize) {
      this->m_minStepSize = minStepSize;
      this->m_maxStepSize = maxStepsize;
      return true;
    }
    pcVar1 = "The maximum step size is expected to be greater than twice the minimum.";
  }
  iDynTree::reportError("MultipleShootingSolver","setStepSizeBounds",pcVar1);
  return false;
}

Assistant:

bool setStepSizeBounds(const double minStepSize, const double maxStepsize) {
                if (minStepSize <= 0){
                    reportError("MultipleShootingSolver", "setStepSizeBounds","The minimum step size is expected to be positive.");
                    return false;
                }

                if (maxStepsize <= (2 * minStepSize)){
                    reportError("MultipleShootingSolver", "setStepSizeBounds","The maximum step size is expected to be greater than twice the minimum."); //imagine to have a distance between two mesh points slightly greater than the max. It would be impossible to add a mesh point in the middle
                    return false;
                }

                m_minStepSize = minStepSize;
                m_maxStepSize = maxStepsize;

                return true;
            }